

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__instance_visual_scene
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  StringHash SVar5;
  int iVar6;
  byte *pbVar7;
  xmlChar **ppxVar8;
  bool failed;
  ParserChar *attributeValue;
  bool local_131;
  ParserTemplateBase *local_130;
  URI *local_128;
  ParserChar *local_120;
  URI local_118;
  
  local_130 = (ParserTemplateBase *)this;
  pbVar4 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x100);
  *(undefined4 *)pbVar4 = instance_visual_scene__AttributeData::DEFAULT;
  local_128 = (URI *)(pbVar4 + 8);
  COLLADABU::URI::URI(local_128,(URI *)&DAT_009e9970,false);
  uVar1 = uRam00000000009e9a60;
  *(undefined8 *)(pbVar4 + 0xf0) = _DAT_009e9a58;
  *(undefined8 *)(pbVar4 + 0xf8) = uVar1;
  *attributeDataPtr = pbVar4;
  ppxVar8 = attributes->attributes;
  if (ppxVar8 != (xmlChar **)0x0) {
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        iVar6 = 3;
      }
      else {
        SVar5 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_120 = ppxVar8[1];
        pbVar7 = pbVar4 + 0xf0;
        if ((SVar5 == 0x79f4) || (pbVar7 = pbVar4 + 0xf8, SVar5 == 0x74835)) {
          *(ParserChar **)pbVar7 = local_120;
LAB_006b2e45:
          iVar6 = 0;
        }
        else if (SVar5 == 0x7c8c) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_120,&local_131);
          COLLADABU::URI::operator=(local_128,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if (local_131 == true) {
            bVar3 = false;
            bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (local_130,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                               0xe110bc5,0x7c8c,local_120);
            if (!bVar2) goto LAB_006b2e79;
            iVar6 = 1;
          }
          else {
LAB_006b2e79:
            iVar6 = 4;
            bVar3 = true;
            if (local_131 == false) {
              *pbVar4 = *pbVar4 | 1;
            }
          }
          if (bVar3) goto LAB_006b2e45;
        }
        else {
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (local_130,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0xe110bc5,
                             text,local_120);
          iVar6 = 1;
          if (!bVar3) goto LAB_006b2e45;
        }
        ppxVar8 = ppxVar8 + 2;
      }
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      return false;
    }
  }
  if ((*pbVar4 & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(local_128,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  if (((*pbVar4 & 1) == 0) &&
     (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_130,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,
                         0xe110bc5,0x7c8c,(ParserChar *)0x0), bVar3)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__instance_visual_scene( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__instance_visual_scene( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

instance_visual_scene__AttributeData* attributeData = newData<instance_visual_scene__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_url:
    {
bool failed;
attributeData->url = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INSTANCE_VISUAL_SCENE,
        HASH_ATTRIBUTE_url,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= instance_visual_scene__AttributeData::ATTRIBUTE_URL_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_sid:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INSTANCE_VISUAL_SCENE,
            HASH_ATTRIBUTE_sid,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_name:
    {

attributeData->name = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->name, strlen(attributeData->name));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INSTANCE_VISUAL_SCENE,
            HASH_ATTRIBUTE_name,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_INSTANCE_VISUAL_SCENE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & instance_visual_scene__AttributeData::ATTRIBUTE_URL_PRESENT) == 0)
{
    attributeData->url = COLLADABU::URI("");
}
if ( (attributeData->present_attributes & instance_visual_scene__AttributeData::ATTRIBUTE_URL_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INSTANCE_VISUAL_SCENE, HASH_ATTRIBUTE_url, 0 ) )
        return false;
}


    return true;
}